

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O2

void __thiscall Kernel::VariableIterator::VariableIterator(VariableIterator *this,TermList t)

{
  Stack<const_Kernel::TermList_*> *this_00;
  bool bVar1;
  
  (this->super_IteratorCore<Kernel::TermList>)._refCnt = 0;
  (this->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore =
       (_func_int **)&PTR__VariableIterator_009ff868;
  this_00 = &this->_stack;
  Lib::Stack<const_Kernel::TermList_*>::Stack(this_00,8);
  this->_used = false;
  this->_aux[0]._content = 2;
  this->_aux[1]._content = 2;
  if ((t._content & 1) == 0) {
    if (((*(byte *)(t._content + 0x28) & 8) != 0) &&
       (bVar1 = Term::ground((Term *)t._content), bVar1)) {
      return;
    }
    Lib::Stack<const_Kernel::TermList_*>::push
              (this_00,(TermList *)
                       (t._content + 0x28 + (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8));
  }
  else {
    this->_aux[0]._content = 2;
    this->_aux[1]._content = t._content;
    Lib::Stack<const_Kernel::TermList_*>::push(this_00,this->_aux + 1);
  }
  return;
}

Assistant:

VariableIterator(TermList t) : _stack(8), _used(false)
  {
    if(t.isVar()) {
      // see #hack 1
      _aux[0] = TermList::empty();
      _aux[1]=t;
      _stack.push(&_aux[1]);
    }
    else {
      Term* term=t.term();
      if(!term->shared() || !term->ground()) {
	_stack.push(term->args());
      }
    }
  }